

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O3

boolean destroy_item(int osym,int dmgtyp)

{
  short sVar1;
  obj *poVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  boolean bVar12;
  int iVar13;
  int iVar14;
  ushort uVar15;
  long lVar16;
  obj *obj;
  bool bVar17;
  
  if (dmgtyp == 2) {
    if (u.uprops[1].intrinsic != 0 || u.uprops[1].extrinsic != 0) {
      if ((u.uprops[1].intrinsic >> 0x1a & 1) == 0) {
        return '\0';
      }
      if ((u.uprops[1].intrinsic & 0xfbffffff) != 0 || u.uprops[1].extrinsic != 0) {
        return '\0';
      }
    }
    uVar15 = youmonst.mintrinsics & 1;
  }
  else if (dmgtyp == 6) {
    if (u.uprops[5].intrinsic != 0 || u.uprops[5].extrinsic != 0) {
      if ((u.uprops[5].intrinsic >> 0x1a & 1) == 0) {
        return '\0';
      }
      if ((u.uprops[5].intrinsic & 0xfbffffff) != 0 || u.uprops[5].extrinsic != 0) {
        return '\0';
      }
    }
    uVar15 = youmonst.mintrinsics & 0x10;
  }
  else {
    if (dmgtyp != 3) goto LAB_00299f7f;
    if (u.uprops[2].intrinsic != 0 || u.uprops[2].extrinsic != 0) {
      if ((u.uprops[2].intrinsic >> 0x1a & 1) == 0) {
        return '\0';
      }
      if ((u.uprops[2].intrinsic & 0xfbffffff) != 0 || u.uprops[2].extrinsic != 0) {
        return '\0';
      }
    }
    uVar15 = youmonst.mintrinsics & 2;
  }
  if (uVar15 != 0) {
    return '\0';
  }
LAB_00299f7f:
  if (uarmc == (obj *)0x0) {
    bVar17 = true;
  }
  else {
    bVar17 = uarmc->otyp != 0x84;
  }
  if (invent == (obj *)0x0) {
    return '\0';
  }
  uVar8 = 0xf;
  if (bVar17) {
    uVar8 = 3;
  }
  bVar12 = '\0';
  obj = invent;
  do {
    poVar2 = obj->nobj;
    if ((((obj->oclass != osym) || (obj->oartifact != '\0')) ||
        (((obj->field_0x4c & 0x80) != 0 && (obj->quan == 1)))) ||
       ((!bVar17 && (uVar4 = mt_random(), 0x33333333 < uVar4 * -0x33333333)))) goto LAB_00299ff8;
    if (dmgtyp == 2) {
      if (((u.uprops[1].intrinsic == 0 && u.uprops[1].extrinsic == 0) ||
          (((u.uprops[1].intrinsic >> 0x1a & 1) != 0 &&
           ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)))) &&
         ((youmonst.mintrinsics & 1) == 0)) {
        uVar15 = 0;
      }
      else {
        uVar15 = (ushort)(obj->oclass != '\b');
      }
      sVar1 = obj->otyp;
      if (sVar1 == 0x1bd) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0029a1d5;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0029a1d0;
LAB_0029a207:
          pcVar7 = xname(obj);
          pcVar7 = The(pcVar7);
          pcVar6 = hcolor("dark red");
          pline("%s glows a strange %s, but remains intact.",pcVar7,pcVar6);
        }
        else {
LAB_0029a1d0:
          if (ublindf != (obj *)0x0) {
LAB_0029a1d5:
            bVar3 = true;
            if (ublindf->oartifact != '\x1d') goto LAB_0029a24e;
            goto LAB_0029a207;
          }
        }
        bVar3 = true;
      }
      else {
        bVar3 = sVar1 == 0x162 || sVar1 == 0x17f;
      }
LAB_0029a24e:
      iVar14 = obj->quan;
      uVar4 = 1;
      if (osym == 10) {
        iVar13 = 3;
      }
      else if (osym == 9) {
        iVar13 = 2;
      }
      else {
        if (osym != 8) goto LAB_00299ff8;
        uVar4 = mt_random();
        uVar4 = uVar4 % 6 + 1;
        iVar13 = 1;
      }
      if (!bVar3) {
        if (((((u.uprops[1].intrinsic >> 0x1a & 1) != 0) &&
             ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)) &&
            ((youmonst.mintrinsics & 1) == 0)) && (obj->oclass != '\b')) {
          uVar4 = uVar4 + 1 >> 1;
        }
LAB_0029a307:
        lVar10 = (long)((*(int *)&obj->field_0x4a << 8) >> 0x1f);
        lVar11 = lVar10 + iVar14;
        if (lVar11 != 0 && SCARRY8(lVar10,(long)iVar14) == lVar11 < 0) {
          lVar10 = lVar11;
          lVar16 = 0;
          do {
            lVar9 = lVar16;
            uVar5 = mt_random();
            lVar16 = lVar9 + (ulong)(uVar5 % uVar8 == 0);
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
          if (lVar16 != 0) {
            pcVar7 = "Some of your";
            if (lVar16 == 1) {
              pcVar7 = "One of your";
            }
            if (lVar16 == lVar11) {
              pcVar7 = "Your";
            }
            pcVar6 = xname(obj);
            pline("%s %s %s!",pcVar7,pcVar6,destroy_strings[(uint)(lVar16 != 1) + iVar13 * 3]);
            if ((dmgtyp != 3 && osym == 8) && ((~(youmonst.data)->mflags1 & 0x1400) != 0)) {
              potionbreathe(obj);
            }
            if (obj->owornmask != 0) {
              if ((obj->owornmask & 0x60000U) == 0) {
                setnotworn(obj);
              }
              else {
                Ring_gone(obj);
              }
            }
            if (obj == current_wand) {
              current_wand = (obj *)0x0;
            }
            lVar9 = lVar9 + (ulong)(uVar5 % uVar8 == 0);
            do {
              useup(obj);
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
            if (uVar15 == 0) {
              pcVar7 = destroy_strings[(ulong)(uint)(iVar13 * 3) + 2];
              if (lVar16 != 1) {
                pcVar7 = makeplural(pcVar7);
              }
              losehp(uVar4,pcVar7,(uint)(lVar16 != 1));
              exercise(0,'\0');
            }
            else {
              pline("You aren\'t hurt!");
            }
            bVar12 = '\x01';
          }
        }
      }
    }
    else if (dmgtyp == 6) {
      if ((u.uprops[5].intrinsic == 0 && u.uprops[5].extrinsic == 0) ||
         ((uVar15 = 1, (u.uprops[5].intrinsic >> 0x1a & 1) != 0 &&
          ((u.uprops[5].intrinsic & 0xfbffffff) == 0 && u.uprops[5].extrinsic == 0)))) {
        uVar15 = youmonst.mintrinsics >> 4 & 1;
      }
      if ((osym == 0xb) && (obj->otyp != 0x1d5)) {
        iVar14 = obj->quan;
        uVar5 = mt_random();
        uVar4 = uVar5 % 10 + 1;
        iVar13 = 4;
        if (((u.uprops[5].intrinsic >> 0x1a & 1) != 0) &&
           (((u.uprops[5].intrinsic & 0xfbffffff) == 0 && u.uprops[5].extrinsic == 0 &&
            ((youmonst.mintrinsics & 0x10) == 0)))) {
          uVar4 = uVar5 % 10 + 2 >> 1;
        }
        goto LAB_0029a307;
      }
    }
    else if (((dmgtyp == 3) && (osym == 8)) && (obj->otyp != 0x142)) {
      iVar14 = obj->quan;
      uVar4 = mt_random();
      uVar4 = (uVar4 & 3) + 1;
      uVar15 = 0;
      iVar13 = 0;
      goto LAB_0029a307;
    }
LAB_00299ff8:
    obj = poVar2;
    if (poVar2 == (obj *)0x0) {
      return bVar12;
    }
  } while( true );
}

Assistant:

boolean destroy_item(int osym, int dmgtyp)
{
	struct obj *obj, *obj2;
	int dmg, xresist, skip;
	long i, cnt, quan;
	int dindx;
	const char *mult;
	boolean seen_destroy = FALSE;
	boolean cloak_protect;

	/* elemental immunities prevent item destruction */
	if ((dmgtyp == AD_COLD && FCold_resistance) ||
	    (dmgtyp == AD_FIRE && FFire_resistance) ||
	    (dmgtyp == AD_ELEC && FShock_resistance))
	    return FALSE;

	/* cloak of protection prevents 80% of item destruction */
	cloak_protect = (uarmc && uarmc->otyp == CLOAK_OF_PROTECTION);

	for (obj = invent; obj; obj = obj2) {
	    obj2 = obj->nobj;
	    if (obj->oclass != osym) continue; /* test only objs of type osym */
	    if (obj->oartifact) continue; /* don't destroy artifacts */
	    if (obj->in_use && obj->quan == 1) continue; /* not available */
	    if (cloak_protect && rn2(5)) continue;
	    xresist = skip = 0;
	    dmg = dindx = 0;
	    quan = 0L;

	    switch(dmgtyp) {
		case AD_COLD:
		    if (osym == POTION_CLASS && obj->otyp != POT_OIL) {
			quan = obj->quan;
			dindx = 0;
			dmg = rnd(4);
		    } else skip++;
		    break;
		case AD_FIRE:
		    xresist = (FFire_resistance && obj->oclass != POTION_CLASS);

		    if (obj->otyp == SCR_FIRE || obj->otyp == SPE_FIREBALL)
			skip++;
		    if (obj->otyp == SPE_BOOK_OF_THE_DEAD) {
			skip++;
			if (!Blind)
			    pline("%s glows a strange %s, but remains intact.",
				The(xname(obj)), hcolor("dark red"));
		    }
		    quan = obj->quan;
		    switch(osym) {
			case POTION_CLASS:
			    dindx = 1;
			    dmg = rnd(6);
			    break;
			case SCROLL_CLASS:
			    dindx = 2;
			    dmg = 1;
			    break;
			case SPBOOK_CLASS:
			    dindx = 3;
			    dmg = 1;
			    break;
			default:
			    skip++;
			    break;
		    }
		    /* Partial fire resistance only helps if full fire immunity
		     * would have helped otherwise. */
		    if (!skip && PFire_resistance && obj->oclass != POTION_CLASS)
			dmg = (dmg + 1) / 2;
		    break;
		case AD_ELEC:
		    xresist = FShock_resistance;
		    quan = obj->quan;
		    switch(osym) {
			case WAND_CLASS:
			    if (obj->otyp == WAN_LIGHTNING) { skip++; break; }
			    dindx = 4;
			    dmg = rnd(10);
			    break;
			default:
			    skip++;
			    break;
		    }
		    /* Partial shock resistance only helps if full shock resistance
		     * would have helped otherwise. */
		    if (!skip && PShock_resistance)
			dmg = (dmg + 1) / 2;
		    break;
		default:
		    skip++;
		    break;
	    }
	    if (!skip) {
		if (obj->in_use) --quan; /* one will be used up elsewhere */
		for (i = cnt = 0L; i < quan; i++)
		    if (!rn2(cloak_protect ? 15 : 3)) cnt++;

		if (!cnt) continue;
		seen_destroy = TRUE;
		if (cnt == quan)	mult = "Your";
		else	mult = (cnt == 1L) ? "One of your" : "Some of your";
		pline("%s %s %s!", mult, xname(obj),
			(cnt > 1L) ? destroy_strings[dindx*3 + 1]
				  : destroy_strings[dindx*3]);
		if (osym == POTION_CLASS && dmgtyp != AD_COLD) {
		    if (!breathless(youmonst.data) || haseyes(youmonst.data))
		    	potionbreathe(obj);
		}
		if (obj->owornmask) {
		    if (obj->owornmask & W_RING) /* ring being worn */
			Ring_gone(obj);
		    else
			setnotworn(obj);
		}
		if (obj == current_wand) current_wand = 0;	/* destroyed */
		for (i = 0; i < cnt; i++)
		    useup(obj);
		if (dmg) {
		    if (xresist)	pline("You aren't hurt!");
		    else {
			const char *how = destroy_strings[dindx * 3 + 2];
			boolean one = (cnt == 1L);

			losehp(dmg, one ? how : (const char *)makeplural(how),
			       one ? KILLED_BY_AN : KILLED_BY);
			exercise(A_STR, FALSE);
		    }
		}
	    }
	}

	return seen_destroy;
}